

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

void bssl::dtls_clear_outgoing_messages(SSL *ssl)

{
  DTLS1_STATE *pDVar1;
  
  InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::Shrink(&ssl->d1->outgoing_messages,0);
  std::__uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter> *
             )&ssl->d1->sent_records,(pointer)0x0);
  pDVar1 = ssl->d1;
  pDVar1->outgoing_written = '\0';
  pDVar1->outgoing_offset = 0;
  *(byte *)pDVar1 = *(byte *)pDVar1 & 0xfd;
  *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xfffb;
  *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffdf;
  dtls_clear_unused_write_epochs(ssl);
  return;
}

Assistant:

void dtls_clear_outgoing_messages(SSL *ssl) {
  ssl->d1->outgoing_messages.clear();
  ssl->d1->sent_records = nullptr;
  ssl->d1->outgoing_written = 0;
  ssl->d1->outgoing_offset = 0;
  ssl->d1->outgoing_messages_complete = false;
  ssl->d1->flight_has_reply = false;
  ssl->d1->sending_flight = false;
  dtls_clear_unused_write_epochs(ssl);
}